

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat * __thiscall Mat::resize(Mat *this,int a,int b)

{
  reference pvVar1;
  ll128 *plVar2;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  size_type __n;
  Mat *in_RDI;
  int j_1;
  int i_1;
  int l;
  int j;
  int i;
  vector<__int128,_std::allocator<__int128>_> temp;
  Mat *ret;
  Mat *in_stack_ffffffffffffff58;
  undefined8 uVar3;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff60;
  Mat *this_00;
  undefined4 in_stack_ffffffffffffff80;
  int iVar4;
  undefined4 in_stack_ffffffffffffff84;
  int iVar5;
  int local_78;
  int local_40;
  int local_3c;
  vector<__int128,_std::allocator<__int128>_> local_38;
  byte local_19;
  int local_18;
  int local_14;
  
  local_19 = 0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  Mat((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
      (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)0x10b924);
  for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < in_RSI[1]; local_40 = local_40 + 1) {
      get(in_stack_ffffffffffffff58,0,0x10b965);
      std::vector<__int128,_std::allocator<__int128>_>::push_back
                (in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
    }
  }
  local_78 = 0;
  for (iVar5 = 0; iVar5 < local_14; iVar5 = iVar5 + 1) {
    for (iVar4 = 0; iVar4 < local_18; iVar4 = iVar4 + 1) {
      __n = (size_type)local_78;
      local_78 = local_78 + 1;
      pvVar1 = std::vector<__int128,_std::allocator<__int128>_>::operator[](&local_38,__n);
      this_00 = *(Mat **)pvVar1;
      uVar3 = *(undefined8 *)((long)pvVar1 + 8);
      plVar2 = operator()(this_00,(int)((ulong)uVar3 >> 0x20),(int)uVar3);
      *(undefined8 *)((long)plVar2 + 8) = uVar3;
      *(Mat **)plVar2 = this_00;
    }
  }
  local_19 = 1;
  std::vector<__int128,_std::allocator<__int128>_>::~vector
            ((vector<__int128,_std::allocator<__int128>_> *)in_RDI);
  if ((local_19 & 1) == 0) {
    ~Mat((Mat *)0x10ba9c);
  }
  return in_RDI;
}

Assistant:

Mat Mat::resize(int a, int b) {
    Mat ret(a, b);
    vector<ll128> temp;
    for (int i = 0; i < r; i++)
        for (int j = 0; j < c; j++)
            temp.push_back(get(i, j));
    int l = 0;
    for (int i = 0; i < a; i++)
        for (int j = 0; j < b; j++) {
            ret(i, j) = temp[l++];
        }
    return ret;
}